

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_C14NDocSaveTo(PyObject *self,PyObject *args)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  FILE *local_98;
  xmlNodeSetPtr local_90;
  FILE *local_88;
  xmlChar **idx;
  int len;
  int result;
  xmlOutputBufferPtr buf;
  FILE *output;
  xmlChar **prefixes;
  xmlNodeSetPtr nodes;
  xmlDocPtr doc;
  PyObject *pPStack_48;
  int with_comments;
  PyObject *pyobj_prefixes;
  PyObject *pPStack_38;
  int exclusive;
  PyObject *pyobj_nodes;
  PyObject *py_file;
  PyObject *pyobj_doc;
  PyObject *args_local;
  PyObject *self_local;
  
  output = (FILE *)0x0;
  pyobj_doc = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOiOiO:C14NDocSaveTo",&py_file,&stack0xffffffffffffffc8,
                     (long)&pyobj_prefixes + 4,&stack0xffffffffffffffb8,(long)&doc + 4,&pyobj_nodes)
  ;
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (py_file == (PyObject *)&_Py_NoneStruct) {
      local_90 = (xmlNodeSetPtr)0x0;
    }
    else {
      local_90 = (xmlNodeSetPtr)py_file[1].ob_refcnt;
    }
    nodes = local_90;
    if (local_90 == (xmlNodeSetPtr)0x0) {
      PyErr_SetString(_PyExc_TypeError,"bad document.");
      self_local = (PyObject *)0x0;
    }
    else {
      if (pyobj_nodes == (PyObject *)&_Py_NoneStruct) {
        local_98 = (FILE *)0x0;
      }
      else {
        local_98 = libxml_PyFileGet(pyobj_nodes);
      }
      if (local_98 == (FILE *)0x0) {
        PyErr_SetString(_PyExc_TypeError,"bad file.");
        self_local = (PyObject *)0x0;
      }
      else {
        uVar3 = xmlOutputBufferCreateFile(local_98,0);
        iVar1 = PyxmlNodeSet_Convert(pPStack_38,(xmlNodeSetPtr *)&prefixes);
        if (iVar1 < 0) {
          xmlOutputBufferClose(uVar3);
          self_local = (PyObject *)0x0;
        }
        else if ((pyobj_prefixes._4_4_ == 0) ||
                (iVar1 = PystringSet_Convert(pPStack_48,(xmlChar ***)&output), -1 < iVar1)) {
          iVar1 = xmlC14NDocSaveTo(nodes,prefixes,pyobj_prefixes._4_4_,output,doc._4_4_,uVar3);
          if (prefixes != (xmlChar **)0x0) {
            (*_xmlFree)(prefixes[1]);
            (*_xmlFree)(prefixes);
          }
          if (output != (FILE *)0x0) {
            local_88 = output;
            while (*(long *)local_88 != 0) {
              (*_xmlFree)(*(long *)local_88);
              local_88 = (FILE *)&local_88->_IO_read_ptr;
            }
            (*_xmlFree)(output);
          }
          libxml_PyFileRelease(local_98);
          iVar2 = xmlOutputBufferClose(uVar3);
          if (iVar1 < 0) {
            PyErr_SetString(_PyExc_Exception,"libxml2 xmlC14NDocSaveTo failure.");
            self_local = (PyObject *)0x0;
          }
          else {
            self_local = (PyObject *)PyLong_FromLong((long)iVar2);
          }
        }
        else {
          if (prefixes != (xmlChar **)0x0) {
            (*_xmlFree)(prefixes[1]);
            (*_xmlFree)(prefixes);
          }
          xmlOutputBufferClose(uVar3);
          self_local = (PyObject *)0x0;
        }
      }
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_C14NDocSaveTo(ATTRIBUTE_UNUSED PyObject * self,
                     PyObject * args)
{
    PyObject *pyobj_doc;
    PyObject *py_file;
    PyObject *pyobj_nodes;
    int exclusive;
    PyObject *pyobj_prefixes;
    int with_comments;

    xmlDocPtr doc;
    xmlNodeSetPtr nodes;
    xmlChar **prefixes = NULL;
    FILE * output;
    xmlOutputBufferPtr buf;

    int result;
    int len;

    if (!PyArg_ParseTuple(args, (char *) "OOiOiO:C14NDocSaveTo",
                          &pyobj_doc,
                          &pyobj_nodes,
                          &exclusive,
                          &pyobj_prefixes,
                          &with_comments,
                          &py_file))
        return (NULL);

    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    if (!doc) {
        PyErr_SetString(PyExc_TypeError, "bad document.");
        return NULL;
    }

    output = PyFile_Get(py_file);
    if (output == NULL) {
        PyErr_SetString(PyExc_TypeError, "bad file.");
        return NULL;
    }
    buf = xmlOutputBufferCreateFile(output, NULL);

    result = PyxmlNodeSet_Convert(pyobj_nodes, &nodes);
    if (result < 0) {
        xmlOutputBufferClose(buf);
        return NULL;
    }

    if (exclusive) {
        result = PystringSet_Convert(pyobj_prefixes, &prefixes);
        if (result < 0) {
            if (nodes) {
                xmlFree(nodes->nodeTab);
                xmlFree(nodes);
            }
            xmlOutputBufferClose(buf);
            return NULL;
        }
    }

    result = xmlC14NDocSaveTo(doc,
                              nodes,
                              exclusive,
                              prefixes,
                              with_comments,
                              buf);

    if (nodes) {
        xmlFree(nodes->nodeTab);
        xmlFree(nodes);
    }
    if (prefixes) {
        xmlChar ** idx = prefixes;
        while (*idx) xmlFree(*(idx++));
        xmlFree(prefixes);
    }

    PyFile_Release(output);
    len = xmlOutputBufferClose(buf);

    if (result < 0) {
        PyErr_SetString(PyExc_Exception,
                        "libxml2 xmlC14NDocSaveTo failure.");
        return NULL;
    }
    else
        return PyLong_FromLong((long) len);
}